

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

QString * formatBacktraceForLogMessage
                    (QString *__return_storage_ptr__,BacktraceParams *backtraceParams,
                    QMessageLogContext *ctx)

{
  char *pcVar1;
  int iVar2;
  qsizetype seplen;
  QByteArray info;
  QByteArray info_00;
  qsizetype qVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  QArrayData *pQVar7;
  char *pcVar8;
  qsizetype qVar9;
  QString *pQVar10;
  pointer pQVar11;
  undefined8 extraout_RAX;
  char *pcVar12;
  char *oldD;
  QString *pQVar13;
  QArrayData *data;
  char *pcVar14;
  QString *pQVar15;
  char16_t *sep;
  QArrayData *pQVar16;
  long in_FS_OFFSET;
  QLatin1StringView needle;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QLatin1StringView haystack;
  QLatin1StringView haystack_00;
  QLatin1StringView haystack_01;
  QLatin1StringView haystack_02;
  QLatin1StringView haystack_03;
  QLatin1StringView haystack_04;
  QLatin1StringView needle_00;
  QLatin1StringView needle_01;
  QLatin1StringView needle_02;
  QLatin1StringView needle_03;
  QLatin1StringView needle_04;
  undefined8 in_stack_fffffffffffffe88;
  QArrayData *in_stack_fffffffffffffe90;
  QArrayData *in_stack_fffffffffffffe98;
  QArrayData *data_00;
  QString *local_158;
  QString *local_150;
  QByteArray local_120;
  QArrayDataPointer<QString> local_108;
  QString local_e8;
  QString QStack_d0;
  QString local_b8;
  QString local_98;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  QByteArray local_70;
  QArrayData *local_58;
  QString *pQStack_50;
  QString *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ctx->version < 3) || (*(char *)&ctx[9].category == '\0')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    data = &((backtraceParams->backtraceSeparator).d.d)->super_QArrayData;
    sep = (backtraceParams->backtraceSeparator).d.ptr;
    seplen = (backtraceParams->backtraceSeparator).d.size;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar2 = backtraceParams->backtraceDepth;
    pcVar12 = &DAT_aaaaaaaaaaaaaaaa;
    local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    if (*(char *)&ctx[9].category == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        formatBacktraceForLogMessage();
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,1,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(extraout_RAX);
        }
      }
    }
    else {
      local_108.d = (Data *)0x0;
      local_108.ptr = (QString *)0x0;
      local_108.size = 0;
      if (iVar2 != 0) {
        if (ctx[1].file == (char *)0x0) {
          in_stack_fffffffffffffe98 = (QArrayData *)0x0;
        }
        else {
          pcVar14 = ctx[1].function;
          pcVar6 = pcVar14 + (long)ctx[1].file * 8;
          local_150 = (QString *)0x0;
          local_158 = (QString *)0x0;
          in_stack_fffffffffffffe98 = (QArrayData *)0x0;
          pQVar16 = (QArrayData *)0x0;
          do {
            local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            QStack_d0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            QStack_d0.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QStack_d0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            uStack_80 = 0xaaaaaaaa;
            uStack_7c = 0xaaaaaaaa;
            local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            iVar5 = dladdr(*(undefined8 *)pcVar14,&local_98);
            qVar3 = local_98.d.size;
            pQVar7 = &(local_98.d.d)->super_QArrayData;
            if (iVar5 == 0) {
              QStack_d0.d.ptr = (char16_t *)0x0;
              QStack_d0.d.size = 0;
              local_e8.d.size = 0;
              QStack_d0.d.d = (Data *)0x0;
              local_e8.d.d = (Data *)0x0;
              local_e8.d.ptr = (char16_t *)0x0;
            }
            else {
              if ((QString *)local_98.d.size == (QString *)0x0) {
                pQVar13 = (QString *)0x0;
              }
              else {
                pQVar15 = (QString *)0xffffffffffffffff;
                do {
                  pQVar13 = (QString *)((long)&(pQVar15->d).d + 1);
                  pcVar12 = (char *)((long)&((DataPointer *)local_98.d.size)->d + 1) + (long)pQVar15
                  ;
                  pQVar15 = pQVar13;
                } while (*pcVar12 != '\0');
              }
              pcVar12 = strrchr((char *)local_98.d.d,0x2f);
              if (pcVar12 == (char *)0x0) {
                if (pQVar7 == (QArrayData *)0x0) {
                  pQVar15 = (QString *)0x0;
                }
                else {
                  pQVar15 = (QString *)0xffffffffffffffff;
                  do {
                    pcVar12 = (char *)((long)&(((Data *)pQVar7)->super_QArrayData).ref_._q_value.
                                              super___atomic_base<int>._M_i + 1) + (long)pQVar15;
                    pQVar15 = (QString *)((long)&(pQVar15->d).d + 1);
                  } while (*pcVar12 != '\0');
                }
              }
              else {
                pQVar7 = (QArrayData *)(pcVar12 + 1);
                pQVar15 = (QString *)0xffffffffffffffff;
                do {
                  pcVar8 = pcVar12 + 2 + (long)pQVar15;
                  pQVar15 = (QString *)((long)&(pQVar15->d).d + 1);
                } while (*pcVar8 != '\0');
              }
              if ((undefined1 *)local_108.size == (undefined1 *)0x0) {
                haystack_00.m_data = (char *)pQVar7;
                haystack_00.m_size = (qsizetype)pQVar15;
                needle_00.m_data = "Qt6Core";
                needle_00.m_size = 7;
                pcVar12 = &DAT_00000007;
                qVar9 = QtPrivate::findString(haystack_00,0,needle_00,CaseSensitive);
                if (qVar9 != -1) {
                  if (pQVar13 != (QString *)0x0) {
                    haystack_01.m_data = (char *)qVar3;
                    haystack_01.m_size = (qsizetype)pQVar13;
                    needle_01.m_data = "6QDebug";
                    needle_01.m_size = 7;
                    pcVar12 = &DAT_00000007;
                    qVar9 = QtPrivate::findString(haystack_01,0,needle_01,CaseSensitive);
                    if (qVar9 == -1) {
                      haystack_02.m_data = (char *)qVar3;
                      haystack_02.m_size = (qsizetype)pQVar13;
                      needle_02.m_data = "14QMessageLogger";
                      needle_02.m_size = 0x10;
                      pcVar12 = (char *)0x10;
                      qVar9 = QtPrivate::findString(haystack_02,0,needle_02,CaseSensitive);
                      if (qVar9 == -1) {
                        haystack_03.m_data = (char *)qVar3;
                        haystack_03.m_size = (qsizetype)pQVar13;
                        needle_03.m_data = "17qt_message_output";
                        needle_03.m_size = 0x13;
                        pcVar12 = (char *)0x13;
                        qVar9 = QtPrivate::findString(haystack_03,0,needle_03,CaseSensitive);
                        if (qVar9 == -1) {
                          haystack_04.m_data = (char *)qVar3;
                          haystack_04.m_size = (qsizetype)pQVar13;
                          needle_04.m_data = "26QInternalMessageLogContext";
                          needle_04.m_size = 0x1c;
                          pcVar12 = (char *)0x1c;
                          qVar9 = QtPrivate::findString(haystack_04,0,needle_04,CaseSensitive);
                          if (qVar9 == -1) goto LAB_0021462c;
                        }
                      }
                    }
                  }
                  QStack_d0.d.ptr = (char16_t *)0x0;
                  QStack_d0.d.size = 0;
                  local_e8.d.size = 0;
                  QStack_d0.d.d = (Data *)0x0;
                  local_e8.d.d = (Data *)0x0;
                  local_e8.d.ptr = (char16_t *)0x0;
                  goto LAB_002149b5;
                }
              }
LAB_0021462c:
              local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              needle.m_data = "_Z";
              needle.m_size = 2;
              pcVar12 = "_Z";
              haystack.m_data = (char *)qVar3;
              haystack.m_size = (qsizetype)pQVar13;
              bVar4 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
              if (bVar4) {
                pcVar12 = (char *)0x0;
                pcVar8 = (char *)__cxa_demangle(qVar3,0,0);
                if (pcVar8 == (char *)0x0) {
                  if ((QString *)qVar3 == (QString *)0x0) {
                    pQVar13 = (QString *)0x0;
                  }
                  else {
                    pQVar10 = (QString *)0xffffffffffffffff;
                    do {
                      pQVar13 = (QString *)((long)&(pQVar10->d).d + 1);
                      pcVar1 = (char *)((long)&((DataPointer *)qVar3)->d + 1) + (long)pQVar10;
                      pQVar10 = pQVar13;
                    } while (*pcVar1 != '\0');
                  }
                  ba_01.m_data = pcVar12;
                  ba_01.m_size = qVar3;
                  QString::fromUtf8(&local_b8,pQVar13,ba_01);
                }
                else {
                  QByteArray::QByteArray(&local_70,pcVar8,-1);
                  info.d.ptr = (char *)data;
                  info.d.d = (Data *)in_stack_fffffffffffffe88;
                  info.d.size = (qsizetype)in_stack_fffffffffffffe98;
                  qCleanupFuncinfo((QByteArray *)&local_58,info);
                  ba.m_data = pcVar12;
                  ba.m_size = (qsizetype)pQStack_50;
                  QString::fromUtf8(&local_b8,local_48,ba);
                  if (local_58 != (QArrayData *)0x0) {
                    LOCK();
                    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_58,1,0x10);
                    }
                  }
                  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                }
                free(pcVar8);
              }
              else {
                ba_00.m_data = pcVar12;
                ba_00.m_size = qVar3;
                QString::fromLatin1((QString *)&local_58,pQVar13,ba_00);
                local_b8.d.d = (Data *)local_58;
                local_b8.d.ptr = (char16_t *)pQStack_50;
                local_b8.d.size = (qsizetype)local_48;
              }
              pQVar13 = local_150;
              if (pQVar7 != pQVar16) {
                if (pQVar7 == (QArrayData *)0x0) {
                  pQVar15 = (QString *)0x0;
                }
                ba_02.m_data = pcVar12;
                ba_02.m_size = (qsizetype)pQVar7;
                data_00 = in_stack_fffffffffffffe98;
                QString::fromUtf8((QString *)&local_58,pQVar15,ba_02);
                pQVar13 = local_48;
                pQVar15 = pQStack_50;
                in_stack_fffffffffffffe98 = local_58;
                pQStack_50 = local_158;
                local_48 = local_150;
                pcVar12 = (char *)local_150;
                local_158 = pQVar15;
                pQVar16 = pQVar7;
                local_58 = data_00;
                if (data_00 != (QArrayData *)0x0) {
                  LOCK();
                  (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
                       (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(data_00,2,0x10);
                    pcVar12 = (char *)local_150;
                  }
                }
              }
              if (in_stack_fffffffffffffe98 != (QArrayData *)0x0) {
                LOCK();
                (in_stack_fffffffffffffe98->ref_)._q_value.super___atomic_base<int>._M_i =
                     (in_stack_fffffffffffffe98->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              QStack_d0.d.d = local_b8.d.d;
              QStack_d0.d.ptr = local_b8.d.ptr;
              QStack_d0.d.size = local_b8.d.size;
              local_150 = pQVar13;
              local_e8.d.d = (Data *)in_stack_fffffffffffffe98;
              local_e8.d.ptr = (char16_t *)local_158;
              local_e8.d.size = (qsizetype)pQVar13;
              if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + 1;
                UNLOCK();
                LOCK();
                ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
LAB_002149b5:
            if ((QString *)local_e8.d.size == (QString *)0x0) {
              if ((undefined1 *)local_108.size != (undefined1 *)0x0) {
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = L"???";
                local_98.d.size = 3;
                QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                          ((QMovableArrayOps<QString> *)&local_108,local_108.size,&local_98);
                QList<QString>::end((QList<QString> *)&local_108);
                goto LAB_00214a8c;
              }
            }
            else if ((QString *)QStack_d0.d.size == (QString *)0x0) {
              local_58 = (QArrayData *)CONCAT62(local_58._2_6_,0x3f);
              pcVar12 = (char *)&local_e8;
              local_48 = (QString *)CONCAT62(local_48._2_6_,0x3f);
              pQStack_50 = (QString *)pcVar12;
              QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>::convertTo<QString>
                        (&local_98,
                         (QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t> *)&local_58)
              ;
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)&local_108,local_108.size,&local_98);
              QList<QString>::end((QList<QString> *)&local_108);
LAB_00214a8c:
              if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            else {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)&local_108,local_108.size,&QStack_d0);
              QList<QString>::end((QList<QString> *)&local_108);
            }
            qVar3 = local_108.size;
            if (&(QStack_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((QStack_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((QStack_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((QStack_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(QStack_d0.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
              }
            }
          } while (((undefined1 *)qVar3 != (undefined1 *)(long)iVar2) &&
                  (pcVar14 = pcVar14 + 8, pcVar14 != pcVar6));
        }
        in_stack_fffffffffffffe90 = data;
        if (in_stack_fffffffffffffe98 != (QArrayData *)0x0) {
          LOCK();
          (in_stack_fffffffffffffe98->ref_)._q_value.super___atomic_base<int>._M_i =
               (in_stack_fffffffffffffe98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((in_stack_fffffffffffffe98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(in_stack_fffffffffffffe98,2,0x10);
          }
        }
      }
      if ((undefined1 *)local_108.size == (undefined1 *)0x0) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      else {
        if ((ctx->function != (char *)0x0) &&
           (bVar4 = QString::startsWith(local_108.ptr,(QChar)0x3f,CaseSensitive), bVar4)) {
          QByteArray::QByteArray(&local_120,ctx->function,-1);
          info_00.d.ptr = (char *)in_stack_fffffffffffffe90;
          info_00.d.d = (Data *)in_stack_fffffffffffffe88;
          info_00.d.size = (qsizetype)in_stack_fffffffffffffe98;
          qCleanupFuncinfo((QByteArray *)&local_98,info_00);
          ba_03.m_data = pcVar12;
          ba_03.m_size = (qsizetype)local_98.d.ptr;
          QString::fromUtf8(&local_e8,(QString *)local_98.d.size,ba_03);
          pQVar11 = QList<QString>::data((QList<QString> *)&local_108);
          pQVar16 = &((pQVar11->d).d)->super_QArrayData;
          (pQVar11->d).d = local_e8.d.d;
          pQVar13 = (QString *)(pQVar11->d).ptr;
          (pQVar11->d).ptr = local_e8.d.ptr;
          pQVar15 = (QString *)(pQVar11->d).size;
          (pQVar11->d).size = local_e8.d.size;
          local_e8.d.d = (Data *)pQVar16;
          local_e8.d.ptr = (char16_t *)pQVar13;
          local_e8.d.size = (qsizetype)pQVar15;
          if (pQVar16 != (QArrayData *)0x0) {
            LOCK();
            (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar16,2,0x10);
            }
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        if ((QChar *)sep == (QChar *)0x0) {
          sep = L"";
        }
        QtPrivate::QStringList_join
                  (__return_storage_ptr__,(QStringList *)&local_108,(QChar *)sep,seplen);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static QString formatBacktraceForLogMessage(const QMessagePattern::BacktraceParams backtraceParams,
                                            const QMessageLogContext &ctx)
{
    // do we have a backtrace stored?
    if (ctx.version <= QMessageLogContext::CurrentVersion)
        return QString();

    auto &fullctx = static_cast<const QInternalMessageLogContext &>(ctx);
    if (!fullctx.backtrace.has_value())
        return QString();

    QString backtraceSeparator = backtraceParams.backtraceSeparator;
    int backtraceDepth = backtraceParams.backtraceDepth;

    QStringList frames = backtraceFramesForLogMessage(backtraceDepth, *fullctx.backtrace);
    if (frames.isEmpty())
        return QString();

    // if the first frame is unknown, replace it with the context function
    if (ctx.function && frames.at(0).startsWith(u'?'))
        frames[0] = QString::fromUtf8(qCleanupFuncinfo(ctx.function));

    return frames.join(backtraceSeparator);
}